

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,static_string_view keyword,cmExpandedCommandArgument *argument
          )

{
  cmMakefile *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  string *psVar2;
  cmListFileContext *context;
  ostream *poVar3;
  cmake *this_01;
  PolicyID id;
  string local_220;
  string local_1f0;
  undefined1 local_1d0 [8];
  ostringstream e;
  bool isKeyword;
  cmExpandedCommandArgument *argument_local;
  cmConditionEvaluator *this_local;
  static_string_view keyword_local;
  
  if (((this->Policy54Status == WARN) || (this->Policy54Status == OLD)) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    keyword_local.super_string_view._M_str._7_1_ = std::operator==(__x,keyword.super_string_view);
    if (((keyword_local.super_string_view._M_str._7_1_) &&
        (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1)) &&
       (this->Policy54Status == WARN)) {
      this_00 = this->Makefile;
      context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                          (&(this->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this_00,context);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x36,id);
        poVar3 = std::operator<<((ostream *)local_1d0,(string *)&local_1f0);
        poVar3 = std::operator<<(poVar3,"\nQuoted keywords like \"");
        psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        std::operator<<(poVar3,
                        "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       );
        std::__cxx11::string::~string((string *)&local_1f0);
        this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_220,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      }
    }
  }
  else {
    keyword_local.super_string_view._M_str._7_1_ = false;
  }
  return keyword_local.super_string_view._M_str._7_1_;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(
  cm::static_string_view keyword,
  const cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  const auto isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)
        << "\n"
           "Quoted keywords like \"" << argument.GetValue() << "\" "
           "will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}